

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O1

void __thiscall ixy::IxgbeDevice::wait_for_link(IxgbeDevice *this)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  uint local_44;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_std::ios_base_&(&)(std::ios_base_&)>,_const_unsigned_int_&>,_const_char_*>_>
  local_40;
  
  local_40.list.first.first.first.second = "waiting for link...";
  info<ixy::Pair<ixy::None,char_const*>>
            ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp",
             0x1a9,"wait_for_link",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&local_40);
  iVar2 = (*(this->super_IxyDevice)._vptr_IxyDevice[10])(this);
  if (iVar2 == 0) {
    uVar4 = 10000;
    do {
      local_40.list.first.first.first._0_8_ = 0;
      local_40.list.first.first.first.second = (char *)0x989680;
      do {
        iVar2 = nanosleep((timespec *)&local_40,(timespec *)&local_40);
        if (iVar2 != -1) break;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
      iVar2 = (*(this->super_IxyDevice)._vptr_IxyDevice[10])(this);
    } while ((iVar2 == 0) && (bVar1 = 10 < uVar4, uVar4 = uVar4 - 10, bVar1));
  }
  local_44 = (*(this->super_IxyDevice)._vptr_IxyDevice[10])(this);
  local_40.list.first.second = &local_44;
  local_40.list.first.first.first.second = "link speed is ";
  local_40.list.first.first.second = std::dec;
  local_40.list.second = " Mbit/s";
  info<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,std::ios_base&(&)(std::ios_base&)>,unsigned_int_const&>,char_const*>>
            ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp",
             0x1b0,"wait_for_link",&local_40);
  return;
}

Assistant:

void IxgbeDevice::wait_for_link() {
    info("waiting for link...");
    auto max_wait = 10000;    // 10 seconds in milliseconds
    auto poll_interval = 10; // milliseconds
    while (!(get_link_speed()) && max_wait > 0) {
        std::this_thread::sleep_for(std::chrono::milliseconds(poll_interval));
        max_wait -= poll_interval;
    }
    info("link speed is " << std::dec << get_link_speed() << " Mbit/s");
}